

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void mi_heap_delete(mi_heap_t *heap)

{
  mi_heap_t *heap_00;
  size_t sVar1;
  long lVar2;
  void *adst;
  
  if (heap != &_mi_heap_empty && heap != (mi_heap_t *)0x0) {
    heap_00 = heap->tld->heap_backing;
    if (((heap_00 == heap) || (heap_00->tag != heap->tag)) || (heap_00->arena_id != heap->arena_id))
    {
      mi_heap_collect_ex(heap,MI_ABANDON);
    }
    else if (heap->page_count != 0) {
      _mi_heap_delayed_free_partial(heap);
      lVar2 = 0x500;
      do {
        sVar1 = _mi_page_queue_append
                          (heap_00,(mi_page_queue_t *)((long)heap_00->keys + lVar2 + -0x28),
                           (mi_page_queue_t *)((long)heap->keys + lVar2 + -0x28));
        heap_00->page_count = heap_00->page_count + sVar1;
        heap->page_count = heap->page_count - sVar1;
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0xc08);
      _mi_heap_delayed_free_all(heap);
      memset(heap->pages_free_direct,0,0x408);
      memcpy(heap->pages,_mi_heap_empty.pages,0x708);
      LOCK();
      heap->thread_delayed_free = (mi_block_t *)0x0;
      UNLOCK();
      heap->page_count = 0;
    }
    mi_heap_free(heap);
    return;
  }
  return;
}

Assistant:

void mi_heap_delete(mi_heap_t* heap)
{
  mi_assert(heap != NULL);
  mi_assert(mi_heap_is_initialized(heap));
  mi_assert_expensive(mi_heap_is_valid(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;

  mi_heap_t* bheap = heap->tld->heap_backing;
  if (bheap != heap && mi_heaps_are_compatible(bheap,heap)) {
    // transfer still used pages to the backing heap
    mi_heap_absorb(bheap, heap);
  }
  else {
    // the backing heap abandons its pages
    _mi_heap_collect_abandon(heap);
  }
  mi_assert_internal(heap->page_count==0);
  mi_heap_free(heap);
}